

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O3

void * tcmalloc::retry_do_memalign(void *arg)

{
  ulong uVar1;
  Span *pSVar2;
  void *pvVar3;
  ulong uVar4;
  retry_memalign_data *data;
  
  uVar1 = *arg;
  uVar4 = *(ulong *)((long)arg + 8);
  if (CARRY8(uVar4,uVar1)) {
    return (void *)0x0;
  }
  uVar4 = uVar4 + (uVar4 == 0);
  pSVar2 = PageHeap::NewAligned
                     ((PageHeap *)Static::pageheap_,
                      ((uVar4 >> 0xd) + 1) - (ulong)((uVar4 & 0x1fff) == 0),
                      ((uVar1 >> 0xd) + 1) - (ulong)((uVar1 & 0x1fff) == 0));
  if (pSVar2 == (Span *)0x0) {
    pvVar3 = (void *)0x0;
  }
  else {
    pvVar3 = (void *)(pSVar2->start << 0xd);
  }
  return pvVar3;
}

Assistant:

static void *retry_do_memalign(void *arg) {
  retry_memalign_data *data = static_cast<retry_memalign_data *>(arg);
  return do_memalign_pages(data->align, data->size);
}